

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O3

void pcp_fill_in6_addr(in6_addr *dst_ip6,uint16_t *dst_port,uint32_t *dst_scope_id,sockaddr *src)

{
  undefined8 uVar1;
  uint32_t uVar2;
  
  if (src->sa_family == 10) {
    if (dst_ip6 != (in6_addr *)0x0) {
      uVar1 = *(undefined8 *)(src + 1);
      *(undefined8 *)&dst_ip6->__in6_u = *(undefined8 *)(src->sa_data + 6);
      *(undefined8 *)((long)&dst_ip6->__in6_u + 8) = uVar1;
    }
    if (dst_port != (uint16_t *)0x0) {
      *dst_port = *(uint16_t *)src->sa_data;
    }
    if (dst_scope_id != (uint32_t *)0x0) {
      uVar2 = *(uint32_t *)(src[1].sa_data + 6);
LAB_001073dd:
      *dst_scope_id = uVar2;
      return;
    }
  }
  else if (src->sa_family == 2) {
    if (dst_ip6 != (in6_addr *)0x0) {
      *(undefined8 *)&dst_ip6->__in6_u = 0;
      (dst_ip6->__in6_u).__u6_addr32[2] = 0xffff0000;
      (dst_ip6->__in6_u).__u6_addr32[3] = *(uint32_t *)(src->sa_data + 2);
    }
    if (dst_port != (uint16_t *)0x0) {
      *dst_port = *(uint16_t *)src->sa_data;
    }
    uVar2 = 0;
    if (dst_scope_id != (uint32_t *)0x0) goto LAB_001073dd;
  }
  return;
}

Assistant:

void pcp_fill_in6_addr(struct in6_addr *dst_ip6, uint16_t *dst_port,
                       uint32_t *dst_scope_id, struct sockaddr *src) {
    if (src->sa_family == AF_INET) {
        struct sockaddr_in *src_ip4 = (struct sockaddr_in *)src;

        if (dst_ip6) {
            S6_ADDR32(dst_ip6)[0] = 0;
            S6_ADDR32(dst_ip6)[1] = 0;
            S6_ADDR32(dst_ip6)[2] = htonl(0xFFFF);
            S6_ADDR32(dst_ip6)[3] = src_ip4->sin_addr.s_addr;
        }
        if (dst_port) {
            *dst_port = src_ip4->sin_port;
        }
        if (dst_scope_id) {
            *dst_scope_id = 0;
        }
    } else if (src->sa_family == AF_INET6) {
        struct sockaddr_in6 *src_ip6 = (struct sockaddr_in6 *)src;

        if (dst_ip6) {
            memcpy(dst_ip6, src_ip6->sin6_addr.s6_addr, sizeof(*dst_ip6));
        }
        if (dst_port) {
            *dst_port = src_ip6->sin6_port;
        }
        if (dst_scope_id) {
            *dst_scope_id = src_ip6->sin6_scope_id;
        }
    }
}